

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cTextureBarrierTests.cpp
# Opt level: O3

void __thiscall
gl4cts::TextureBarrierSameTexelRWBase::updateTextureData(TextureBarrierSameTexelRWBase *this)

{
  uint uVar1;
  uint uVar2;
  GLuint i;
  uint uVar3;
  long lVar4;
  GLuint GVar5;
  GLuint *pGVar6;
  bool bVar7;
  
  uVar2 = (this->super_TextureBarrierBasicOutline).m_width;
  if (uVar2 != 0) {
    uVar3 = (this->super_TextureBarrierBasicOutline).m_height;
    uVar1 = 0;
    do {
      bVar7 = uVar3 != 0;
      uVar3 = 0;
      if (bVar7) {
        uVar2 = 0;
        do {
          lVar4 = 0;
          do {
            if (((((int)uVar1 < 0) || ((int)uVar2 < 0)) ||
                (uVar3 = (this->super_TextureBarrierBasicOutline).m_width, uVar3 <= uVar1)) ||
               ((this->super_TextureBarrierBasicOutline).m_height <= uVar2)) {
              TextureBarrierBasicOutline::texel(unsigned_int*,unsigned_int,unsigned_int)::zero = 0;
              GVar5 = 1;
              pGVar6 = &TextureBarrierBasicOutline::texel(unsigned_int*,unsigned_int,unsigned_int)::
                        zero;
            }
            else {
              pGVar6 = (this->super_TextureBarrierBasicOutline).m_reference[lVar4] +
                       (uVar3 * uVar2 + uVar1);
              GVar5 = *pGVar6 + 1;
            }
            *pGVar6 = GVar5;
            lVar4 = lVar4 + 1;
          } while (lVar4 != 8);
          uVar2 = uVar2 + 1;
          uVar3 = (this->super_TextureBarrierBasicOutline).m_height;
        } while (uVar2 < uVar3);
        uVar2 = (this->super_TextureBarrierBasicOutline).m_width;
      }
      uVar1 = uVar1 + 1;
    } while (uVar1 < uVar2);
  }
  return;
}

Assistant:

virtual void updateTextureData()
	{
		for (GLuint x = 0; x < m_width; ++x)
			for (GLuint y = 0; y < m_height; ++y)
			{
				for (GLuint i = 0; i < NUM_TEXTURES; ++i)
				{
					texel(m_reference[i], x, y)++;
				}
			}
	}